

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_gnutar(archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  wchar_t wVar1;
  dev_t dVar2;
  int64_t iVar3;
  wchar_t local_4c;
  wchar_t err;
  int64_t t;
  archive_entry_header_gnutar *header;
  size_t *unconsumed_local;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  local_4c = header_common(a,tar,entry,h);
  a_local._4_4_ = local_4c;
  if ((((local_4c != L'\xffffffe2') &&
       ((wVar1 = _archive_entry_copy_pathname_l(entry,(char *)h,100,tar->sconv), wVar1 == L'\0' ||
        (local_4c = set_conversion_failed_error(a,tar->sconv,"Pathname"), a_local._4_4_ = local_4c,
        local_4c != L'\xffffffe2')))) &&
      ((wVar1 = _archive_entry_copy_uname_l(entry,(char *)((long)h + 0x109),0x20,tar->sconv),
       wVar1 == L'\0' ||
       (local_4c = set_conversion_failed_error(a,tar->sconv,"Uname"), a_local._4_4_ = local_4c,
       local_4c != L'\xffffffe2')))) &&
     ((wVar1 = _archive_entry_copy_gname_l(entry,(char *)((long)h + 0x129),0x20,tar->sconv),
      wVar1 == L'\0' ||
      (local_4c = set_conversion_failed_error(a,tar->sconv,"Gname"), a_local._4_4_ = local_4c,
      local_4c != L'\xffffffe2')))) {
    if ((*(char *)((long)h + 0x9c) == '3') || (*(char *)((long)h + 0x9c) == '4')) {
      dVar2 = tar_atol((char *)((long)h + 0x149),8);
      archive_entry_set_rdevmajor(entry,dVar2);
      dVar2 = tar_atol((char *)((long)h + 0x151),8);
      archive_entry_set_rdevminor(entry,dVar2);
    }
    else {
      archive_entry_set_rdev(entry,0);
    }
    tar->entry_padding = -tar->entry_bytes_remaining & 0x1ff;
    iVar3 = tar_atol((char *)((long)h + 0x159),0xc);
    if (0 < iVar3) {
      archive_entry_set_atime(entry,iVar3,0);
    }
    iVar3 = tar_atol((char *)((long)h + 0x165),0xc);
    if (0 < iVar3) {
      archive_entry_set_ctime(entry,iVar3,0);
    }
    if (*(char *)((long)h + 0x1e3) != '\0') {
      iVar3 = tar_atol((char *)((long)h + 0x1e3),0xc);
      tar->realsize = iVar3;
      archive_entry_set_size(entry,tar->realsize);
      tar->realsize_override = 1;
    }
    if ((*(char *)((long)h + 0x182) == '\0') ||
       (wVar1 = gnu_sparse_old_read(a,tar,(archive_entry_header_gnutar *)h,unconsumed),
       wVar1 == L'\0')) {
      a_local._4_4_ = local_4c;
    }
    else {
      a_local._4_4_ = L'\xffffffe2';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
header_gnutar(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	const struct archive_entry_header_gnutar *header;
	int64_t t;
	int err = ARCHIVE_OK;

	/*
	 * GNU header is like POSIX ustar, except 'prefix' is
	 * replaced with some other fields. This also means the
	 * filename is stored as in old-style archives.
	 */

	/* Grab fields common to all tar variants. */
	err = header_common(a, tar, entry, h);
	if (err == ARCHIVE_FATAL)
		return (err);

	/* Copy filename over (to ensure null termination). */
	header = (const struct archive_entry_header_gnutar *)h;
	if (archive_entry_copy_pathname_l(entry,
	    header->name, sizeof(header->name), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Pathname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	/* Fields common to ustar and GNU */
	/* XXX Can the following be factored out since it's common
	 * to ustar and gnu tar?  Is it okay to move it down into
	 * header_common, perhaps?  */
	if (archive_entry_copy_uname_l(entry,
	    header->uname, sizeof(header->uname), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Uname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	if (archive_entry_copy_gname_l(entry,
	    header->gname, sizeof(header->gname), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Gname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	/* Parse out device numbers only for char and block specials */
	if (header->typeflag[0] == '3' || header->typeflag[0] == '4') {
		archive_entry_set_rdevmajor(entry, (dev_t)
		    tar_atol(header->rdevmajor, sizeof(header->rdevmajor)));
		archive_entry_set_rdevminor(entry, (dev_t)
		    tar_atol(header->rdevminor, sizeof(header->rdevminor)));
	} else
		archive_entry_set_rdev(entry, 0);

	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);

	/* Grab GNU-specific fields. */
	t = tar_atol(header->atime, sizeof(header->atime));
	if (t > 0)
		archive_entry_set_atime(entry, t, 0);
	t = tar_atol(header->ctime, sizeof(header->ctime));
	if (t > 0)
		archive_entry_set_ctime(entry, t, 0);

	if (header->realsize[0] != 0) {
		tar->realsize
		    = tar_atol(header->realsize, sizeof(header->realsize));
		archive_entry_set_size(entry, tar->realsize);
		tar->realsize_override = 1;
	}

	if (header->sparse[0].offset[0] != 0) {
		if (gnu_sparse_old_read(a, tar, header, unconsumed)
		    != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	} else {
		if (header->isextended[0] != 0) {
			/* XXX WTF? XXX */
		}
	}

	return (err);
}